

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O3

char * __thiscall
Database::query(Database *this,char mktsegmentCondition,uint16_t orderdateCondition,
               uint16_t shipdateCondition,uint16_t topn)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int i;
  long lVar14;
  MaxHeap heap;
  MaxHeap local_70;
  ushort *local_50;
  uint32_t *local_48;
  uint32_t *local_40;
  uint32_t *local_38;
  
  lVar14 = 0;
  do {
    if ("BAHMF"[lVar14] == mktsegmentCondition) goto LAB_0010491a;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  lVar14 = 5;
LAB_0010491a:
  uVar2 = *this->a_orderkey[lVar14];
  MaxHeap::MaxHeap(&local_70,topn);
  if (uVar2 != 0) {
    local_38 = this->a_extendedpricesum[lVar14];
    local_40 = this->l_orderkey;
    local_48 = local_70.c1Result;
    local_50 = local_70.c2Result;
    uVar11 = 1;
    do {
      uVar5 = local_38[uVar11];
      if (uVar5 <= *local_70.c3Result) break;
      uVar4 = this->a_orderdate[lVar14][uVar11];
      if (uVar4 < orderdateCondition) {
        if (shipdateCondition < this->a_minshipdate[lVar14][uVar11]) {
          *local_70.c1Result = this->a_orderkey[lVar14][uVar11];
          *local_70.c2Result = uVar4;
          *local_70.c3Result = uVar5;
          if ((local_70.size != 0) && (local_70.size != 1)) {
            iVar9 = 0;
            iVar8 = 1;
            iVar10 = 0;
            do {
              iVar9 = iVar9 + 2;
              iVar7 = iVar8;
              if ((iVar9 < (int)(uint)local_70.size) &&
                 (iVar7 = iVar9, local_70.c3Result[iVar8] <= local_70.c3Result[iVar9])) {
                iVar7 = iVar8;
              }
              if (local_70.c3Result[iVar10] <= local_70.c3Result[iVar7]) break;
              uVar5 = local_70.c1Result[iVar10];
              uVar3 = local_70.c1Result[iVar7];
              local_70.c1Result[iVar10] = uVar5 ^ uVar3;
              uVar5 = uVar5 ^ uVar3 ^ local_70.c1Result[iVar7];
              local_70.c1Result[iVar7] = uVar5;
              local_70.c1Result[iVar10] = local_70.c1Result[iVar10] ^ uVar5;
              uVar4 = local_70.c2Result[iVar10];
              uVar1 = local_70.c2Result[iVar7];
              local_70.c2Result[iVar10] = uVar4 ^ uVar1;
              uVar4 = uVar4 ^ uVar1 ^ local_70.c2Result[iVar7];
              local_70.c2Result[iVar7] = uVar4;
              local_70.c2Result[iVar10] = local_70.c2Result[iVar10] ^ uVar4;
              uVar5 = local_70.c3Result[iVar10];
              uVar3 = local_70.c3Result[iVar7];
              local_70.c3Result[iVar10] = uVar5 ^ uVar3;
              uVar5 = uVar5 ^ uVar3 ^ local_70.c3Result[iVar7];
              local_70.c3Result[iVar7] = uVar5;
              local_70.c3Result[iVar10] = local_70.c3Result[iVar10] ^ uVar5;
              iVar9 = iVar7 * 2;
              iVar8 = iVar7 * 2 + 1;
              iVar10 = iVar7;
            } while (iVar8 < (int)(uint)local_70.size);
          }
        }
        else if ((shipdateCondition < this->a_maxshipdate[lVar14][uVar11]) &&
                (this->a_lineitemposition[lVar14][uVar11] >> 1 < 0x59686629)) {
          uVar5 = 0;
          uVar13 = (ulong)this->a_lineitemposition[lVar14][uVar11];
          do {
            uVar12 = uVar13 + 1;
            if (local_40[uVar13] != this->a_orderkey[lVar14][uVar11]) break;
            if (shipdateCondition < this->l_shipdate[uVar13]) {
              uVar5 = uVar5 + this->l_extendedprice[uVar13];
            }
            uVar13 = uVar12;
          } while ((int)uVar12 != -0x4d2f33ae);
          if (*local_70.c3Result < uVar5) {
            *local_70.c1Result = this->a_orderkey[lVar14][uVar11];
            *local_70.c2Result = uVar4;
            *local_70.c3Result = uVar5;
            if ((local_70.size != 0) && (local_70.size != 1)) {
              iVar9 = 0;
              iVar8 = 1;
              iVar10 = 0;
              do {
                iVar9 = iVar9 + 2;
                iVar7 = iVar8;
                if ((iVar9 < (int)(uint)local_70.size) &&
                   (iVar7 = iVar9, local_70.c3Result[iVar8] <= local_70.c3Result[iVar9])) {
                  iVar7 = iVar8;
                }
                if (local_70.c3Result[iVar10] <= local_70.c3Result[iVar7]) break;
                uVar5 = local_70.c1Result[iVar10];
                uVar3 = local_70.c1Result[iVar7];
                local_70.c1Result[iVar10] = uVar5 ^ uVar3;
                uVar5 = uVar5 ^ uVar3 ^ local_70.c1Result[iVar7];
                local_70.c1Result[iVar7] = uVar5;
                local_70.c1Result[iVar10] = local_70.c1Result[iVar10] ^ uVar5;
                uVar4 = local_70.c2Result[iVar10];
                uVar1 = local_70.c2Result[iVar7];
                local_70.c2Result[iVar10] = uVar4 ^ uVar1;
                uVar4 = uVar4 ^ uVar1 ^ local_70.c2Result[iVar7];
                local_70.c2Result[iVar7] = uVar4;
                local_70.c2Result[iVar10] = local_70.c2Result[iVar10] ^ uVar4;
                uVar5 = local_70.c3Result[iVar10];
                uVar3 = local_70.c3Result[iVar7];
                local_70.c3Result[iVar10] = uVar5 ^ uVar3;
                uVar5 = uVar5 ^ uVar3 ^ local_70.c3Result[iVar7];
                local_70.c3Result[iVar7] = uVar5;
                local_70.c3Result[iVar10] = local_70.c3Result[iVar10] ^ uVar5;
                iVar9 = iVar7 * 2;
                iVar8 = iVar7 * 2 + 1;
                iVar10 = iVar7;
              } while (iVar8 < (int)(uint)local_70.size);
            }
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 <= uVar2);
  }
  pcVar6 = MaxHeap::getResults(&local_70);
  MaxHeap::~MaxHeap(&local_70);
  return pcVar6;
}

Assistant:

inline char* query(char mktsegmentCondition, uint16_t orderdateCondition, uint16_t shipdateCondition, uint16_t topn) {
    auto p = util::get_key_index(mktsegmentCondition);
    auto A_LENGTH = a_orderkey[p][0];
    MaxHeap heap(topn);
    for (uint32_t pos = 1; pos <= A_LENGTH; ++pos) {
      if (a_extendedpricesum[p][pos] <= heap.top()) {  // early stop
        break;
      }
      if (a_orderdate[p][pos] < orderdateCondition) {
        if (a_minshipdate[p][pos] > shipdateCondition) {
          heap.insert(a_orderkey[p][pos], a_orderdate[p][pos], a_extendedpricesum[p][pos]);
        } else if (a_maxshipdate[p][pos] > shipdateCondition) { // lookup lineitem table
          uint32_t l_position = a_lineitemposition[p][pos];
          uint32_t joinkey = a_orderkey[p][pos];
          uint32_t eps = 0;
          while (l_position < LINEITEM && l_orderkey[l_position] == joinkey) {
            if (l_shipdate[l_position] > shipdateCondition) {
              eps += l_extendedprice[l_position];
            }
            ++l_position;
          }
          heap.insert(a_orderkey[p][pos], a_orderdate[p][pos], eps);
        }
      }
    }
    return heap.getResults();
  }